

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QSize *sz)

{
  int iVar1;
  QDataStream *pQVar2;
  QDataStream *in_RDI;
  QDataStream *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe8;
  qint32 i_00;
  qint16 i;
  
  iVar1 = QDataStream::version(in_RDI);
  i_00 = (qint32)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (iVar1 == 1) {
    QSize::width((QSize *)0x635b55);
    pQVar2 = QDataStream::operator<<
                       (in_stack_ffffffffffffffd8,(qint16)((ulong)in_stack_ffffffffffffffe8 >> 0x30)
                       );
    i = (qint16)((ulong)pQVar2 >> 0x30);
    QSize::height((QSize *)0x635b71);
    QDataStream::operator<<(in_stack_ffffffffffffffd8,i);
  }
  else {
    QSize::width((QSize *)0x635b94);
    pQVar2 = QDataStream::operator<<(in_stack_ffffffffffffffd8,i_00);
    QSize::height((QSize *)0x635baf);
    QDataStream::operator<<(pQVar2,i_00);
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QSize &sz)
{
    if (s.version() == 1)
        s << (qint16)sz.width() << (qint16)sz.height();
    else
        s << (qint32)sz.width() << (qint32)sz.height();
    return s;
}